

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getReceivedFile
          (string *__return_storage_ptr__,ApprovalTestNamer *this,string *extensionWithDot)

{
  allocator local_41;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,".received",&local_41);
  getFullFileName(__return_storage_ptr__,this,&local_40,extensionWithDot);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getReceivedFile(std::string extensionWithDot) const
    {

        return getFullFileName(".received", extensionWithDot);
    }